

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O2

bool __thiscall
cmCTestVC::RunUpdateCommand
          (cmCTestVC *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmd,OutputParser *out,OutputParser *err,Encoding encoding)

{
  bool bVar1;
  ostream *poVar2;
  string local_70;
  string local_50;
  
  ComputeCommandLine(&local_50,cmd);
  std::__cxx11::string::operator=((string *)&this->UpdateCommandLine,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = cmCTest::GetShowOnly(this->CTest);
  if (bVar1) {
    poVar2 = std::operator<<(this->Log,(string *)&this->UpdateCommandLine);
    std::operator<<(poVar2,"\n");
    bVar1 = true;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"",(allocator<char> *)&local_50);
    bVar1 = RunChild(this,cmd,out,err,&local_70,encoding);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return bVar1;
}

Assistant:

bool cmCTestVC::RunUpdateCommand(const std::vector<std::string>& cmd,
                                 OutputParser* out, OutputParser* err,
                                 Encoding encoding)
{
  // Report the command line.
  this->UpdateCommandLine = this->ComputeCommandLine(cmd);
  if (this->CTest->GetShowOnly()) {
    this->Log << this->UpdateCommandLine << "\n";
    return true;
  }

  // Run the command.
  return this->RunChild(cmd, out, err, "", encoding);
}